

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall inja::InjaError::InjaError(InjaError *this,string *type,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *message_local;
  string *type_local;
  InjaError *this_local;
  
  local_20 = message;
  message_local = type;
  type_local = (string *)this;
  ::std::operator+(&local_80,"[inja.exception.",type);
  ::std::operator+(&local_60,&local_80,"] ");
  ::std::operator+(&local_40,&local_60,local_20);
  ::std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  *(undefined ***)this = &PTR__InjaError_0024d0b8;
  ::std::__cxx11::string::string((string *)&this->type,(string *)message_local);
  ::std::__cxx11::string::string((string *)&this->message,(string *)local_20);
  (this->location).line = 0;
  (this->location).column = 0;
  return;
}

Assistant:

explicit InjaError(const std::string& type, const std::string& message)
      : std::runtime_error("[inja.exception." + type + "] " + message), type(type), message(message), location({0, 0}) {}